

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O1

int arkode_butcher_order5h
              (sunrealtype *b,sunrealtype **A1,sunrealtype **A2,sunrealtype *c1,sunrealtype *c2,
              int s)

{
  int iVar1;
  sunrealtype *x;
  sunrealtype *b_00;
  ulong uVar2;
  double dVar3;
  
  x = (sunrealtype *)calloc((long)s,8);
  b_00 = (sunrealtype *)calloc((long)s,8);
  if ((0 < s && (c2 != (sunrealtype *)0x0 && c1 != (sunrealtype *)0x0)) && x != (sunrealtype *)0x0)
  {
    uVar2 = 0;
    do {
      x[uVar2] = c1[uVar2] * c2[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)s != uVar2);
    if ((((0 < s && (c2 != (sunrealtype *)0x0 && c1 != (sunrealtype *)0x0)) &&
          x != (sunrealtype *)0x0) && (iVar1 = arkode_butcher_mv(A2,x,s,b_00), iVar1 == 0)) &&
       (iVar1 = arkode_butcher_mv(A1,b_00,s,x), iVar1 == 0)) {
      if ((b != (sunrealtype *)0x0 && x != (sunrealtype *)0x0) && 0 < s) {
        dVar3 = 0.0;
        uVar2 = 0;
        do {
          dVar3 = dVar3 + b[uVar2] * x[uVar2];
          uVar2 = uVar2 + 1;
        } while ((uint)s != uVar2);
        dVar3 = dVar3 + -0.016666666666666666;
      }
      else {
        dVar3 = NAN;
      }
      if ((b == (sunrealtype *)0x0 || x == (sunrealtype *)0x0) || 0 >= s) {
        return 0;
      }
      free(x);
      free(b_00);
      return (uint)(ABS(dVar3) <= 1.4901161193847656e-08);
    }
  }
  free(x);
  free(b_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order5h(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype** A2, sunrealtype* c1,
                                             sunrealtype* c2, int s)
{
  sunrealtype bAAcc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp1, s, &bAAcc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAAcc - SUN_RCONST(1.0) / SUN_RCONST(60.0)) > TOL) ? SUNFALSE
                                                                     : SUNTRUE;
}